

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O3

void extract_reference_file(char *name)

{
  FILE *__stream;
  char *pcVar1;
  FILE *__stream_00;
  uint uVar2;
  byte *pbVar3;
  char *extra;
  uint uVar4;
  uint uVar5;
  char buff [1024];
  undefined4 local_438;
  short local_434 [514];
  
  extra = name;
  snprintf((char *)&local_438,0x400,"%s/%s.uu",refdir);
  __stream = fopen((char *)&local_438,"r");
  failure("Couldn\'t open reference file %s",&local_438);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                   ,L'ಁ',(uint)(__stream != (FILE *)0x0),"in != NULL",extra);
  if (__stream != (FILE *)0x0) {
    do {
      pcVar1 = fgets((char *)&local_438,0x400,__stream);
      if (pcVar1 == (char *)0x0) {
        return;
      }
    } while (local_434[0] != 0x206e || local_438 != 0x69676562);
    __stream_00 = fopen(name,"wb");
    pcVar1 = fgets((char *)&local_438,0x400,__stream);
    uVar5 = local_438;
    while ((pcVar1 != (char *)0x0 &&
           (local_438._2_1_ = (char)(uVar5 >> 0x10),
           local_438._2_1_ != 'd' || (short)uVar5 != 0x6e65))) {
      local_438 = uVar5;
      if ((uVar5 & 0x3f) != 0x20) {
        uVar5 = uVar5 & 0x3f ^ 0x20;
        pbVar3 = (byte *)((long)&local_438 + 1);
        do {
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                           ,L'ಚ',(uint)((byte)(*pbVar3 - 0x20) < 0x41),"VALID_UUDECODE(p[0])",
                           extra);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                           ,L'ಛ',(uint)((byte)(pbVar3[1] - 0x20) < 0x41),"VALID_UUDECODE(p[1])",
                           extra);
          uVar2 = (pbVar3[1] & 0x3f ^ 0x20) << 0xc;
          fputc(((*pbVar3 & 0x3f ^ 0x20) << 0x12 | uVar2) >> 0x10,__stream_00);
          if (uVar5 == 1) break;
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                           ,L'ಡ',(uint)((byte)(pbVar3[2] - 0x20) < 0x41),"VALID_UUDECODE(p[0])",
                           extra);
          uVar4 = (pbVar3[2] & 0x3f ^ 0x20) << 6;
          fputc((uVar2 | uVar4) >> 8 & 0xff,__stream_00);
          if (uVar5 == 2) break;
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                           ,L'ಧ',(uint)((byte)(pbVar3[3] - 0x20) < 0x41),"VALID_UUDECODE(p[0])",
                           extra);
          fputc((uVar4 & 0xff | pbVar3[3] & 0x3f) ^ 0x20,__stream_00);
          pbVar3 = pbVar3 + 4;
          uVar5 = uVar5 - 3;
        } while (uVar5 != 0);
      }
      pcVar1 = fgets((char *)&local_438,0x400,__stream);
      uVar5 = local_438;
    }
    fclose(__stream_00);
    fclose(__stream);
  }
  return;
}

Assistant:

void
extract_reference_file(const char *name)
{
	char buff[1024];
	FILE *in, *out;

	snprintf(buff, sizeof(buff), "%s/%s.uu", refdir, name);
	in = fopen(buff, "r");
	failure("Couldn't open reference file %s", buff);
	assert(in != NULL);
	if (in == NULL)
		return;
	/* Read up to and including the 'begin' line. */
	for (;;) {
		if (fgets(buff, sizeof(buff), in) == NULL) {
			/* TODO: This is a failure. */
			return;
		}
		if (memcmp(buff, "begin ", 6) == 0)
			break;
	}
	/* Now, decode the rest and write it. */
	out = fopen(name, "wb");
	while (fgets(buff, sizeof(buff), in) != NULL) {
		char *p = buff;
		int bytes;

		if (memcmp(buff, "end", 3) == 0)
			break;

		bytes = UUDECODE(*p++);
		while (bytes > 0) {
			int n = 0;
			/* Write out 1-3 bytes from that. */
			assert(VALID_UUDECODE(p[0]));
			assert(VALID_UUDECODE(p[1]));
			n = UUDECODE(*p++) << 18;
			n |= UUDECODE(*p++) << 12;
			fputc(n >> 16, out);
			--bytes;
			if (bytes > 0) {
				assert(VALID_UUDECODE(p[0]));
				n |= UUDECODE(*p++) << 6;
				fputc((n >> 8) & 0xFF, out);
				--bytes;
			}
			if (bytes > 0) {
				assert(VALID_UUDECODE(p[0]));
				n |= UUDECODE(*p++);
				fputc(n & 0xFF, out);
				--bytes;
			}
		}
	}
	fclose(out);
	fclose(in);
}